

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O1

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Dump
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  Output::Print(L"[");
  if (0xf < this->maxIndex) {
    bVar1 = false;
    uVar3 = 0;
    uVar6 = 0;
    do {
      if (this->backingStore[uVar6] != (uint *)0x0) {
        lVar5 = 0;
        uVar2 = uVar3;
        do {
          uVar4 = (uint)uVar2;
          if ((uVar2 < this->maxIndex) && (this->backingStore[uVar6] != (uint *)0x0)) {
            uVar4 = *(uint *)((long)this->backingStore[uVar6] + lVar5);
          }
          if (uVar2 != uVar4) {
            if (bVar1) {
              Output::Print(L", ");
            }
            Output::Print(L"%u <= %u",(ulong)uVar4,uVar2 & 0xffffffff);
            bVar1 = true;
          }
          lVar5 = lVar5 + 4;
          uVar2 = uVar2 + 1;
        } while (lVar5 != 0x40);
      }
      uVar6 = uVar6 + 1;
      uVar3 = uVar3 + 0x10;
    } while (uVar6 < this->maxIndex >> 4);
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void Dump()
    {
        bool printed = false;
        Output::Print(_u("["));
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] == nullptr)
            {
                continue;
            }
            for (indexType j = 0; j < numPerSegment; j++)
            {
                indexType index = i * numPerSegment + j;
                indexType local = Lookup<false, true>(index);
                if (index != local)
                {
                    if (printed)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%u <= %u"), local, index);
                    printed = true;
                }
            }
        }
        Output::Print(_u("]\n"));
    }